

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mojoshader.c
# Opt level: O2

void emit_ARB1_SGN(Context *ctx)

{
  size_t in_RCX;
  size_t in_RDX;
  size_t buflen;
  size_t buflen_00;
  char scratch2 [64];
  char scratch1 [64];
  char src0 [64];
  char dst [64];
  char acStack_128 [64];
  char local_e8 [64];
  char local_a8 [64];
  char local_68 [64];
  
  if (ctx->profile_supports_nv2 != 0) {
    emit_ARB1_opcode_ds(ctx,"SSG");
    return;
  }
  make_ARB1_destarg_string(ctx,local_68,in_RDX);
  make_ARB1_srcarg_string_in_buf(ctx,ctx->source_args,local_a8,in_RCX);
  allocate_ARB1_scratch_reg_name(ctx,local_e8,buflen);
  allocate_ARB1_scratch_reg_name(ctx,acStack_128,buflen_00);
  output_line(ctx,"SLT %s, %s, 0.0;",local_e8,local_a8);
  output_line(ctx,"SLT %s, -%s, 0.0;",acStack_128,local_a8);
  output_line(ctx,"ADD%s -%s, %s;",local_68,local_e8,acStack_128);
  emit_ARB1_dest_modifiers(ctx);
  return;
}

Assistant:

static void emit_ARB1_SGN(Context *ctx)
{
    if (support_nv2(ctx))
        emit_ARB1_opcode_ds(ctx, "SSG");
    else
    {
        char dst[64];
        char src0[64];
        char scratch1[64];
        char scratch2[64];
        make_ARB1_destarg_string(ctx, dst, sizeof (dst));
        make_ARB1_srcarg_string(ctx, 0, src0, sizeof (src0));
        allocate_ARB1_scratch_reg_name(ctx, scratch1, sizeof (scratch1));
        allocate_ARB1_scratch_reg_name(ctx, scratch2, sizeof (scratch2));
        output_line(ctx, "SLT %s, %s, 0.0;", scratch1, src0);
        output_line(ctx, "SLT %s, -%s, 0.0;", scratch2, src0);
        output_line(ctx, "ADD%s -%s, %s;", dst, scratch1, scratch2);
        emit_ARB1_dest_modifiers(ctx);
    } // else
}